

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O2

void Assimp::ExportSceneXFile
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  DeadlyImportError *pDVar5;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string file;
  string path;
  ExportProperties props;
  XFileExporter iDoTheExportThing;
  long *plVar3;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iDoTheExportThing,pFile,(allocator<char> *)&props);
  DefaultIOSystem::absolutePath(&path,(string *)&iDoTheExportThing);
  std::__cxx11::string::~string((string *)&iDoTheExportThing);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iDoTheExportThing,pFile,(allocator<char> *)&props);
  DefaultIOSystem::completeBaseName(&file,(string *)&iDoTheExportThing);
  std::__cxx11::string::~string((string *)&iDoTheExportThing);
  ExportProperties::ExportProperties(&props,pProperties);
  bVar1 = ExportProperties::HasPropertyBool(&props,"EXPORT_XFILE_64BIT");
  if (!bVar1) {
    ExportProperties::SetPropertyInteger(&props,"EXPORT_XFILE_64BIT",0);
  }
  XFileExporter::XFileExporter(&iDoTheExportThing,pScene,pIOSystem,&path,&file,&props);
  if (((&iDoTheExportThing.field_0x28)[*(long *)(iDoTheExportThing._8_8_ + -0x18)] & 5) == 0) {
    iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 != (long *)0x0) {
      std::__cxx11::stringbuf::str();
      uVar4 = std::ostream::tellp();
      (**(code **)(*plVar3 + 0x18))(plVar3,local_398._M_dataplus._M_p,uVar4,1);
      std::__cxx11::string::~string((string *)&local_398);
      (**(code **)(*plVar3 + 8))(plVar3);
      XFileExporter::~XFileExporter(&iDoTheExportThing);
      ExportProperties::~ExportProperties(&props);
      std::__cxx11::string::~string((string *)&file);
      std::__cxx11::string::~string((string *)&path);
      return;
    }
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,pFile,&local_399);
    std::operator+(&local_398,"could not open output .x file: ",&local_378);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_398);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,pFile,&local_399);
  std::operator+(&local_398,"output data creation failed. Most likely the file became too large: ",
                 &local_378);
  DeadlyImportError::DeadlyImportError(pDVar5,&local_398);
  __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneXFile(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
{
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // create/copy Properties
    ExportProperties props(*pProperties);

    // set standard properties if not set
    if (!props.HasPropertyBool(AI_CONFIG_EXPORT_XFILE_64BIT)) props.SetPropertyBool(AI_CONFIG_EXPORT_XFILE_64BIT, false);

    // invoke the exporter
    XFileExporter iDoTheExportThing( pScene, pIOSystem, path, file, &props);

    if (iDoTheExportThing.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }
    
    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .x file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}